

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ParseFunctionDeclaration(Parser *this)

{
  pointer pFVar1;
  pointer pbVar2;
  FunctionSignature *copy;
  undefined8 uVar3;
  bool bVar4;
  Symbol *pSVar5;
  mapped_type *this_00;
  FunctionPtrList *__range3;
  size_t sVar6;
  FunctionSignature **sig_1;
  pointer ppFVar7;
  FunctionSignature *sig;
  pointer signature_00;
  pointer pbVar8;
  size_t count;
  anon_union_32_12_f16a26ea_for_Variant_1 local_4e0;
  LibraryIPtr library;
  size_t count_1;
  FunctionSignature signature;
  
  signature.m_id = 0;
  signature.m_visibility = Local;
  signature.m_libraryName._M_dataplus._M_p = (pointer)&signature.m_libraryName.field_2;
  signature.m_libraryName._M_string_length = 0;
  signature.m_libraryName.field_2._M_local_buf[0] = '\0';
  signature.m_parts.
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  signature.m_parts.
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  signature.m_parts.
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar1 = (this->m_localFunctions).
           super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::Allocator<Jinx::Impl::FunctionSignature>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar6 = 0;
  signature_00 = (this->m_localFunctions).
                 super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::Allocator<Jinx::Impl::FunctionSignature>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  signature.m_staticArena.m_ptr = (char *)&signature;
  signature.m_parts.
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Tp_alloc_type.m_arena = &signature.m_staticArena;
  for (; signature_00 != pFVar1; signature_00 = signature_00 + 1) {
    bVar4 = CheckFunctionSignature(this,(this->m_currentSymbol)._M_current,signature_00,&count);
    if ((bVar4) &&
       ((ulong)((long)signature.m_parts.
                      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)signature.m_parts.
                     super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_start) <
        (ulong)((long)(signature_00->m_parts).
                      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(signature_00->m_parts).
                     super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_start))) {
      FunctionSignature::operator=(&signature,signature_00);
      sVar6 = count;
    }
  }
  pbVar2 = (this->m_importList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar8 = (this->m_importList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1) {
    Runtime::GetLibraryInternal
              ((Runtime *)&library,
               (String *)
               (this->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    Library::Functions((FunctionPtrList *)&count,
                       library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    uVar3 = local_4e0.m_number;
    for (ppFVar7 = (pointer)count; ppFVar7 != (pointer)uVar3; ppFVar7 = ppFVar7 + 1) {
      bVar4 = CheckFunctionSignature(this,(this->m_currentSymbol)._M_current,*ppFVar7,&count_1);
      if ((bVar4) &&
         (copy = *ppFVar7,
         (ulong)((long)signature.m_parts.
                       super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)signature.m_parts.
                      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                      ._M_impl.super__Vector_impl_data._M_start) <
         (ulong)((long)(copy->m_parts).
                       super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(copy->m_parts).
                      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                      ._M_impl.super__Vector_impl_data._M_start))) {
        FunctionSignature::operator=(&signature,copy);
        sVar6 = count_1;
      }
    }
    std::
    _Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
    ::~_Vector_base((_Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                     *)&count);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pSVar5 = (this->m_currentSymbol)._M_current;
  while( true ) {
    bVar4 = sVar6 == 0;
    sVar6 = sVar6 - 1;
    if (bVar4) break;
    this->m_lastLine = pSVar5->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar5 + 1;
    pSVar5 = pSVar5 + 1;
  }
  EmitOpcode(this,PushVal);
  Variant::Variant((Variant *)&count,signature.m_id);
  Variant::Write((Variant *)&count,&this->m_writer);
  Variant::~Variant((Variant *)&count);
  FunctionSignature::GetName_abi_cxx11_((String *)&count,&signature);
  library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)signature.m_id;
  this_00 = std::
            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
            ::operator[](&this->m_idNameMap,(key_type *)&library);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
            (this_00,(basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&count);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&count);
  FunctionSignature::~FunctionSignature(&signature);
  return;
}

Assistant:

inline_t void Parser::ParseFunctionDeclaration()
	{
		FunctionSignature signature;
		size_t symCount = 0;

		// Check for match in local functions
		for (const auto & sig : m_localFunctions)
		{
			size_t count;
			if (CheckFunctionSignature(m_currentSymbol, sig, &count))
			{
				if (sig.GetLength() > signature.GetLength())
				{
					signature = sig;
					symCount = count;
				}
			}
		}

		// Check for match in all import libraries
		for (const auto & import : m_importList)
		{
			auto library = m_runtime->GetLibraryInternal(import);
			auto functions = library->Functions();
			for (const auto & sig : functions)
			{
				size_t count;
				if (CheckFunctionSignature(m_currentSymbol, *sig, &count))
				{
					if (sig->GetLength() > signature.GetLength())
					{
						signature = *sig;
						symCount = count;
					}
				}
			}
		}

		for (size_t i = 0; i < symCount; ++i)
			NextSymbol();

		// Push the function ID on the stack
		EmitOpcode(Opcode::PushVal);
		EmitValue(signature.GetId());
		m_idNameMap[signature.GetId()] = signature.GetName();
	}